

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

Index __thiscall MADPComponentFactoredStates::SampleInitialState(MADPComponentFactoredStates *this)

{
  Index IVar1;
  undefined8 *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacValues;
  undefined1 local_198 [16];
  pointer local_188;
  
  if (this->_m_initialized != false) {
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_188 = (pointer)0x0;
    SampleInitialState(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198);
    IVar1 = IndexTools::IndividualToJointIndicesStepSize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_198,
                       this->_m_stepSize);
    if ((pointer)local_198._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_198._0_8_,(long)local_188 - local_198._0_8_);
    }
    return IVar1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188,"MADPComponentFactoredStates::SampleInitialState()",0x31);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_188," - Error: not initialized. ",0x1b);
  std::endl<char,std::char_traits<char>>((ostream *)&local_188);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

Index MADPComponentFactoredStates::SampleInitialState() const
{
  if(!_m_initialized)
  {
    stringstream ss;
    ss << "MADPComponentFactoredStates::SampleInitialState()" <<
      " - Error: not initialized. " << endl;
    throw E(ss);
  }

  vector<Index> sfacValues;
  SampleInitialState(sfacValues);
  Index state = FactorValueIndicesToStateIndex(sfacValues);
  return(state);
}